

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

bool basist::basis_validate_output_buffer_size
               (transcoder_texture_format target_format,
               uint32_t output_blocks_buf_size_in_blocks_or_pixels,uint32_t orig_width,
               uint32_t orig_height,uint32_t output_row_pitch_in_blocks_or_pixels,
               uint32_t output_rows_in_pixels,uint32_t total_slice_blocks)

{
  if (target_format - cTFRGBA32 < 4) {
    if (output_row_pitch_in_blocks_or_pixels != 0) {
      orig_width = output_row_pitch_in_blocks_or_pixels;
    }
    if (output_rows_in_pixels != 0) {
      orig_height = output_rows_in_pixels;
    }
  }
  else {
    if (target_format != cTFFXT1_RGB) {
      if (output_blocks_buf_size_in_blocks_or_pixels < total_slice_blocks) {
        return false;
      }
      return true;
    }
    orig_width = orig_width + 7 >> 3;
    orig_height = orig_height + 3 >> 2;
  }
  if (output_blocks_buf_size_in_blocks_or_pixels < orig_height * orig_width) {
    return false;
  }
  return true;
}

Assistant:

bool basis_transcoder_format_is_uncompressed(transcoder_texture_format tex_type)
	{
		switch (tex_type)
		{
		case transcoder_texture_format::cTFRGBA32:
		case transcoder_texture_format::cTFRGB565:
		case transcoder_texture_format::cTFBGR565:
		case transcoder_texture_format::cTFRGBA4444:
			return true;
		default:
			break;
		}
		return false;
	}